

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  int v2;
  int iVar1;
  Nonnull<const_char_*> failure_msg;
  Rep *pRVar2;
  bool bVar3;
  LogMessageFatal local_20;
  
  iVar1 = this->current_size_;
  v2 = allocated_size(this);
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                          (iVar1,v2,"size() <= allocated_size()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    iVar1 = allocated_size(this);
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar1,this->capacity_proxy_ + 1,"allocated_size() <= Capacity()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar3 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar2 = rep(this);
        bVar3 = this->capacity_proxy_ < pRVar2->allocated_size;
      }
      return bVar3;
    }
    iVar1 = 0x28c;
  }
  else {
    iVar1 = 0x28b;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,iVar1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }